

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

int smb_getsock(connectdata *conn,curl_socket_t *socks,int numsocks)

{
  int iVar1;
  
  if (numsocks == 0) {
    return 0;
  }
  *socks = conn->sock[0];
  if ((conn->proto).ftpc.pp.sendsize != 0) {
    return 0x10000;
  }
  iVar1 = 0x10000;
  if ((conn->proto).ftpc.pp.sendleft == 0) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int smb_getsock(struct connectdata *conn, curl_socket_t *socks,
                       int numsocks)
{
  struct smb_conn *smbc = &conn->proto.smbc;

  if(!numsocks)
    return GETSOCK_BLANK;

  socks[0] = conn->sock[FIRSTSOCKET];

  if(smbc->send_size || smbc->upload_size)
    return GETSOCK_WRITESOCK(0);

  return GETSOCK_READSOCK(0);
}